

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O2

int runmcmp(runcxdef *ctx)

{
  runsdef *prVar1;
  byte bVar2;
  byte bVar3;
  runsdef *prVar4;
  ushort *puVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  
  prVar4 = ctx->runcxsp;
  prVar1 = prVar4 + -1;
  if (prVar4[-1].runstyp != '\x03') {
    if (prVar4[-1].runstyp != '\x01') {
      ctx->runcxerr->errcxptr->erraac = 0;
      runsign(ctx,0x3ee);
    }
    ctx->runcxsp = prVar1;
    if (prVar1->runstyp == '\x01') {
      lVar9 = prVar4[-1].runsv.runsvnum;
      ctx->runcxsp = prVar4 + -2;
      if (prVar4[-2].runstyp == '\x01') {
        iVar6 = 1;
        if (prVar4[-2].runsv.runsvnum <= lVar9) {
          iVar6 = -(uint)(prVar4[-2].runsv.runsvnum < lVar9);
        }
        return iVar6;
      }
    }
    ctx->runcxerr->errcxptr->erraac = 0;
    runsign(ctx,0x3eb);
  }
  ctx->runcxsp = prVar1;
  if (prVar1->runstyp == '\x03') {
    puVar5 = (ushort *)prVar4[-1].runsv.runsvstr;
    ctx->runcxsp = prVar4 + -2;
    if (prVar4[-2].runstyp == '\x03') {
      lVar9 = 2;
      while( true ) {
        uVar7 = (uint)*(ushort *)prVar4[-2].runsv.runsvstr;
        uVar8 = (uint)lVar9;
        uVar10 = (uint)*puVar5;
        if ((uVar7 == uVar8) || (uVar10 == uVar8)) {
          if (uVar7 != uVar8) {
            return 1;
          }
          return -(uint)(uVar10 != uVar8);
        }
        bVar2 = *(byte *)((long)puVar5 + lVar9);
        bVar3 = *(byte *)((long)prVar4[-2].runsv.runsvstr + lVar9);
        if (bVar3 < bVar2) {
          return -1;
        }
        if (bVar3 >= bVar2 && bVar3 != bVar2) break;
        lVar9 = lVar9 + 1;
      }
      return 1;
    }
  }
  ctx->runcxerr->errcxptr->erraac = 0;
  runsign(ctx,0x3ef);
}

Assistant:

int runmcmp(runcxdef *ctx)
{
    if (runtostyp(ctx) == DAT_NUMBER)
    {
        long num2 = runpopnum(ctx);
        long num1 = runpopnum(ctx);
        
        if (num1 > num2) return(1);
        else if (num1 < num2) return(-1);
        else return(0);
    }
    else if (runtostyp(ctx) == DAT_SSTRING)
    {
        uchar *str2 = runpopstr(ctx);
        uchar *str1 = runpopstr(ctx);
        uint   len1 = osrp2(str1) - 2;
        uint   len2 = osrp2(str2) - 2;
        
        str1 += 2;
        str2 += 2;
        while (len1 && len2)
        {
            if (*str1 < *str2) return(-1);   /* character from 1 is greater */
            else if (*str1 > *str2) return(1);       /* char from 1 is less */
            
            ++str1;
            ++str2;
            --len1;
            --len2;
        }
        if (len1) return(1);    /* match up to len2, but string 1 is longer */
        else if (len2) return(-1);  /* match up to len1, but str2 is longer */
        else return(0);                            /* strings are identical */
    }
    else
    {
        runsig(ctx, ERR_INVCMP);
    }
    return 0;
}